

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::RunListFile
          (cmMakefile *this,cmListFile *listFile,string *filenametoread,DeferCommands *defer)

{
  cmStateSnapshot *pcVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  string *psVar6;
  _Base_ptr p_Var7;
  pointer pDVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  pointer pDVar12;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  cmExecutionStatus status;
  string id;
  DeferCallScope callScope;
  DeferScope scope;
  string currentFile;
  string currentParentFile;
  undefined1 local_160 [16];
  undefined1 local_150 [24];
  undefined4 local_138;
  _Storage<int,_true> local_134;
  bool local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_110 [32];
  _Base_ptr local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  __node_base local_c0;
  DeferCallScope local_b8;
  DeferScope local_b0;
  string local_a8;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78 [2];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_68;
  bool local_48;
  string *local_40;
  cmStateSnapshot *local_38;
  
  local_f0 = (_Base_ptr)defer;
  local_c0._M_nxt = (_Hash_node_base *)listFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_PARENT_LIST_FILE","");
  psVar6 = (string *)GetDefinition(this,(string *)local_160);
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  local_88 = (_Base_ptr)local_78;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + psVar6->_M_string_length);
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_FILE","");
  psVar6 = (string *)GetDefinition(this,(string *)local_160);
  if (psVar6 == (string *)0x0) {
    psVar6 = &cmValue::Empty_abi_cxx11_;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + psVar6->_M_string_length);
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_FILE","");
  value._M_str = (filenametoread->_M_dataplus)._M_p;
  value._M_len = filenametoread->_M_string_length;
  AddDefinition(this,(string *)local_160,value);
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath((string *)local_110,filenametoread);
  value_00._M_str = (char *)local_110._0_8_;
  value_00._M_len = local_110._8_8_;
  AddDefinition(this,(string *)local_160,value_00);
  if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_PARENT_LIST_FILE","");
  pcVar1 = &this->StateSnapshot;
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_160);
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_160);
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = (cmMakefile *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_DIR","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_160);
  local_40 = filenametoread;
  local_38 = pcVar1;
  if ((cmMakefile *)local_160._0_8_ != (cmMakefile *)local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  lVar11 = (long)*(pointer *)(local_c0._M_nxt + 1) -
           (long)(((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                  &(local_c0._M_nxt)->_M_nxt)->
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 4;
    pcVar2 = local_150 + 8;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    lVar10 = 0;
    do {
      local_150._16_6_ = 0x2e726f727265;
      local_150._8_6_ = 0x776f6e6b6e75;
      local_150._14_2_ = 0x206e;
      local_150._0_8_ = (_Map_pointer)0xe;
      local_150[0x16] = '\0';
      local_130 = false;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._0_1_ = false;
      local_138._1_1_ = false;
      local_138._2_1_ = false;
      local_138._3_1_ = false;
      local_48 = false;
      local_160._0_8_ = this;
      local_160._8_8_ = pcVar2;
      ExecuteCommand(this,(cmListFileFunction *)
                          ((long)&(((((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                       *)&(local_c0._M_nxt)->_M_nxt)->
                                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->Impl).
                                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                          + lVar10),(cmExecutionStatus *)local_160,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68);
      if ((local_48 == true) &&
         (local_48 = false,
         local_68._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_68._M_value + 0x10))) {
        operator_delete((void *)local_68._M_value._M_dataplus._M_p,local_68._16_8_ + 1);
      }
      if ((cmSystemTools::s_FatalErrorOccurred != false) ||
         (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
LAB_002f99bc:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        if ((pointer)local_160._8_8_ != pcVar2) {
          operator_delete((void *)local_160._8_8_,CONCAT26(local_150._14_2_,local_150._8_6_) + 1);
        }
        break;
      }
      if (local_130 == true) {
        (this->GlobalGenerator->CMakeInstance->ScriptModeExitCode).
        super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
             (_Optional_payload_base<int>)((ulong)(uint)local_134._M_value | 0x100000000);
        goto LAB_002f99bc;
      }
      if (local_138._0_1_ == true) {
        RaiseScope(this,&local_128);
        goto LAB_002f99bc;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
      if ((pointer)local_160._8_8_ != pcVar2) {
        operator_delete((void *)local_160._8_8_,CONCAT26(local_150._14_2_,local_150._8_6_) + 1);
      }
      lVar10 = lVar10 + 0x10;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  if (local_f0 != (_Base_ptr)0x0) {
    DeferScope::DeferScope(&local_b0,this,local_40);
    pDVar12 = *(pointer *)local_f0;
    pDVar8 = (pointer)local_f0->_M_parent;
    if (pDVar8 != pDVar12) {
      lVar11 = 0x20;
      uVar9 = 0;
      do {
        if (*(long *)((long)pDVar12 + lVar11 + -0x18) != 0) {
          local_110._0_8_ = local_110 + 0x10;
          p_Var7 = (_Base_ptr)((long)pDVar12 + lVar11 + -0x10);
          p_Var3 = *(_Base_ptr *)((long)pDVar12 + lVar11 + -0x20);
          if (p_Var7 == p_Var3) {
            local_110._16_8_ = *(undefined8 *)p_Var7;
            local_110._24_8_ = *(undefined8 *)((long)pDVar12 + lVar11 + -8);
          }
          else {
            local_110._16_8_ = *(undefined8 *)p_Var7;
            local_110._0_8_ = p_Var3;
          }
          local_110._8_8_ = *(undefined8 *)((long)pDVar12 + lVar11 + -0x18);
          *(_Base_ptr *)((long)pDVar12 + lVar11 + -0x20) = p_Var7;
          *(undefined8 *)((long)pDVar12 + lVar11 + -0x18) = 0;
          *(undefined1 *)((long)pDVar12 + lVar11 + -0x10) = 0;
          DeferCallScope::DeferCallScope
                    (&local_b8,this,(string *)((long)&(pDVar12->Id)._M_dataplus._M_p + lVar11));
          local_150._16_6_ = 0x2e726f727265;
          local_150._8_6_ = 0x776f6e6b6e75;
          local_150._14_2_ = 0x206e;
          local_150._0_8_ = (_Map_pointer)0xe;
          local_150[0x16] = '\0';
          local_130 = false;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_138._0_1_ = false;
          local_138._1_1_ = false;
          local_138._2_1_ = false;
          local_138._3_1_ = false;
          local_e8._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_e8._M_value + 0x10);
          if ((_Base_ptr)local_110._0_8_ == (_Base_ptr)(local_110 + 0x10)) {
            local_e8._24_8_ = local_110._24_8_;
          }
          else {
            local_e8._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_110._0_8_;
          }
          local_e8._16_8_ = local_110._16_8_;
          local_e8._M_value._M_string_length = local_110._8_8_;
          local_110._8_8_ = (_Map_pointer)0x0;
          local_110._16_8_ = local_110._16_8_ & 0xffffffffffffff00;
          local_c8 = true;
          local_160._0_8_ = this;
          local_160._8_8_ = local_150 + 8;
          local_110._0_8_ = (_Base_ptr)(local_110 + 0x10);
          ExecuteCommand(this,(cmListFileFunction *)
                              ((long)&(pDVar12->FilePath)._M_dataplus._M_p + lVar11),
                         (cmExecutionStatus *)local_160,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_e8);
          if ((local_c8 == true) &&
             (local_c8 = false,
             local_e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e8._M_value + 0x10)))
          {
            operator_delete((void *)local_e8._M_value._M_dataplus._M_p,local_e8._16_8_ + 1);
          }
          if (cmSystemTools::s_FatalErrorOccurred == false) {
            bVar5 = cmSystemTools::GetInterruptFlag();
            bVar4 = true;
            if (bVar5) goto LAB_002f9bb5;
          }
          else {
LAB_002f9bb5:
            bVar4 = false;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_128);
          if ((undefined1 *)local_160._8_8_ != local_150 + 8) {
            operator_delete((void *)local_160._8_8_,CONCAT26(local_150._14_2_,local_150._8_6_) + 1);
          }
          PopSnapshot(local_b8.Makefile,true);
          if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          if (!bVar4) break;
          pDVar12 = *(pointer *)local_f0;
          pDVar8 = (pointer)local_f0->_M_parent;
        }
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x50;
      } while (uVar9 < (ulong)(((long)pDVar8 - (long)pDVar12 >> 4) * -0x3333333333333333));
    }
    DeferScope::~DeferScope(&local_b0);
  }
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_PARENT_LIST_FILE","");
  value_01._M_str = (char *)local_88;
  value_01._M_len = (size_t)local_80;
  AddDefinition(this,(string *)local_160,value_01);
  pcVar1 = local_38;
  if ((undefined1 *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_FILE","");
  value_02._M_str = local_a8._M_dataplus._M_p;
  value_02._M_len = local_a8._M_string_length;
  AddDefinition(this,(string *)local_160,value_02);
  if ((undefined1 *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath((string *)local_110,&local_a8);
  value_03._M_str = (char *)local_110._0_8_;
  value_03._M_len = local_110._8_8_;
  AddDefinition(this,(string *)local_160,value_03);
  if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if ((undefined1 *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_PARENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_160);
  if ((undefined1 *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_160);
  if ((undefined1 *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  local_160._0_8_ = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"CMAKE_CURRENT_LIST_DIR","");
  cmStateSnapshot::GetDefinition(pcVar1,(string *)local_160);
  if ((undefined1 *)local_160._0_8_ != local_150) {
    operator_delete((void *)local_160._0_8_,local_150._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != (_Base_ptr)local_78) {
    operator_delete(local_88,(ulong)((long)&local_78[0]->_M_color + 1));
  }
  return;
}

Assistant:

void cmMakefile::RunListFile(cmListFile const& listFile,
                             std::string const& filenametoread,
                             DeferCommands* defer)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread));

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status(*this);
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccurred()) {
      break;
    }
    if (status.HasExitCode()) {
      // cmake_language EXIT was requested, early break.
      this->GetCMakeInstance()->SetScriptModeExitCode(status.GetExitCode());
      break;
    }
    if (status.GetReturnInvoked()) {
      this->RaiseScope(status.GetReturnVariables());
      // Exit early due to return command.
      break;
    }
  }

  // Run any deferred commands.
  if (defer) {
    // Add a backtrace level indicating calls are deferred.
    DeferScope scope(this, filenametoread);

    // Iterate by index in case one deferred call schedules another.
    // NOLINTNEXTLINE(modernize-loop-convert)
    for (size_t i = 0; i < defer->Commands.size(); ++i) {
      DeferCommand& d = defer->Commands[i];
      if (d.Id.empty()) {
        // Canceled.
        continue;
      }
      // Mark as executed.
      std::string id = std::move(d.Id);

      // The deferred call may have come from another file.
      DeferCallScope callScope(this, d.FilePath);

      cmExecutionStatus status(*this);
      this->ExecuteCommand(d.Command, status, std::move(id));
      if (cmSystemTools::GetFatalErrorOccurred()) {
        break;
      }
    }
  }

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile));
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}